

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_unittests.cc
# Opt level: O2

void __thiscall Simple_All_Test::TestBody(Simple_All_Test *this)

{
  AssertionResult *pAVar1;
  int iVar2;
  bool bVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  char *pcVar6;
  bool local_276;
  bool local_275;
  int local_274;
  AssertionResult gtest_ar_2;
  const_iterator local_260;
  pair<google::sparse_hashtable_const_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>,_bool>
  local_218;
  AssertionResult gtest_ar;
  nonempty_iterator local_1a8;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  dmap;
  dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  dset;
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  smap;
  sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  sset;
  
  google::
  sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  ::sparse_hash_set(&sset,0,(hasher *)&smap,(key_equal *)&dset,(allocator_type *)&dmap);
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::sparse_hash_map(&smap,0,(hasher *)&dset,(key_equal *)&dmap,(allocator_type *)&local_218);
  google::
  dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  ::dense_hash_set(&dset,0,(hasher *)&dmap,(key_equal *)&local_218,(allocator_type *)&local_260);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::dense_hash_map(&dmap,0,(hasher *)&local_218,(key_equal *)&local_260,(allocator_type *)&gtest_ar)
  ;
  local_218.first.ht._0_4_ = 0xffffffff;
  google::
  dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  ::set_empty_key(&dset.rep,(key_type *)&local_218);
  local_218.first.ht._0_4_ = -1;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::set_empty_key(&dmap.rep,(key_type *)&local_218);
  for (local_260.ht._0_4_ = 0; (int)local_260.ht < 100; local_260.ht._0_4_ = (int)local_260.ht + 10)
  {
    google::
    sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::insert(&local_218,&sset,(value_type *)&local_260);
    iVar2 = (int)local_260.ht;
    pvVar4 = google::
             sparse_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                         *)&smap,(key_type *)&local_260);
    pvVar4->second = iVar2 + 1;
    gtest_ar._0_4_ = (int)local_260.ht + 5;
    google::
    dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::insert((pair<google::dense_hashtable_const_iterator<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>,_bool>
              *)&local_218,&dset,(value_type *)&gtest_ar);
    iVar2 = (int)local_260.ht;
    local_218.first.ht._0_4_ = (int)local_260.ht + 5;
    pvVar5 = google::
             dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
             ::find_or_insert<int,int>
                       ((dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                         *)&dmap,(int *)&local_218);
    pvVar5->second = iVar2 + 6;
  }
  local_274 = 0;
  do {
    if (99 < local_274) {
LAB_006b534b:
      free(dmap.rep.table);
      free(dset.rep.table);
      std::
      vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>
      ::~vector(&smap.rep.table.groups);
      std::
      vector<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
      ::~vector(&sset.rep.table.groups);
      return;
    }
    google::
    sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::find<int>(&local_218.first,&sset.rep,&local_274);
    google::
    sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::end(&local_260,&sset.rep);
    gtest_ar_2.success_ =
         google::
         const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>_>
         ::operator!=(&local_218.first.pos,&local_260.pos);
    local_276 = local_274 % 10 == 0;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar,"sset.find(i) != sset.end()","(i % 10) == 0",
               &gtest_ar_2.success_,&local_276);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_218);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_260,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x3c,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)&local_218);
LAB_006b52d6:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_260);
      if ((long *)CONCAT44(local_218.first.ht._4_4_,(int)local_218.first.ht) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_218.first.ht._4_4_,(int)local_218.first.ht) + 8))();
      }
      pAVar1 = &gtest_ar;
LAB_006b5346:
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&pAVar1->message_);
      goto LAB_006b534b;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    google::
    sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find<int>((iterator *)&local_218,&smap.rep,&local_274);
    google::
    sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::end((iterator *)&local_260,&smap.rep);
    gtest_ar_2.success_ =
         google::
         two_d_iterator<std::vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>_>
         ::operator!=((two_d_iterator<std::vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>_>
                       *)&local_218.first.pos,(iterator *)&local_260.pos);
    local_276 = local_274 % 10 == 0;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar,"smap.find(i) != smap.end()","(i % 10) == 0",
               &gtest_ar_2.success_,&local_276);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_218);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_260,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x3d,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)&local_218);
      goto LAB_006b52d6;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    google::
    sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find<int>((iterator *)&local_218,&smap.rep,&local_274);
    google::
    sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::end((iterator *)&local_260,&smap.rep);
    bVar3 = google::
            two_d_iterator<std::vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>_>
            ::operator!=((two_d_iterator<std::vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>_>
                          *)&local_218.first.pos,(iterator *)&local_260.pos);
    if (bVar3) {
      google::
      sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::find<int>((iterator *)&gtest_ar,&smap.rep,&local_274);
      local_276 = local_1a8->second == local_274 + 1;
    }
    else {
      local_276 = false;
    }
    local_275 = local_274 % 10 == 0;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar_2,"smap.find(i) != smap.end() && smap.find(i)->second == i + 1"
               ,"(i % 10) == 0",&local_276,&local_275);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&local_218);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)gtest_ar_2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_260,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x3f,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)&local_218);
LAB_006b5327:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_260);
      if ((long *)CONCAT44(local_218.first.ht._4_4_,(int)local_218.first.ht) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_218.first.ht._4_4_,(int)local_218.first.ht) + 8))();
      }
      pAVar1 = &gtest_ar_2;
      goto LAB_006b5346;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    google::
    dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::find<int>((const_iterator *)&local_218,&dset.rep,&local_274);
    google::
    dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::end((const_iterator *)&local_260,&dset.rep);
    gtest_ar_2.success_ =
         local_218.first.pos.row_begin._M_current != local_260.pos.row_begin._M_current;
    local_276 = local_274 % 10 == 5;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar,"dset.find(i) != dset.end()","(i % 10) == 5",
               &gtest_ar_2.success_,&local_276);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_218);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_260,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x40,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)&local_218);
      goto LAB_006b52d6;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    google::
    dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find<int>((iterator *)&local_218,&dmap.rep,&local_274);
    google::
    dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::end((iterator *)&local_260,&dmap.rep);
    gtest_ar_2.success_ =
         local_218.first.pos.row_begin._M_current != local_260.pos.row_begin._M_current;
    local_276 = local_274 % 10 == 5;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar,"dmap.find(i) != dmap.end()","(i % 10) == 5",
               &gtest_ar_2.success_,&local_276);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_218);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_260,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x41,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)&local_218);
      goto LAB_006b52d6;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    google::
    dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find<int>((iterator *)&local_218,&dmap.rep,&local_274);
    google::
    dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::end((iterator *)&local_260,&dmap.rep);
    if (local_218.first.pos.row_begin._M_current == local_260.pos.row_begin._M_current) {
      local_276 = false;
    }
    else {
      google::
      dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::find<int>((iterator *)&gtest_ar,&dmap.rep,&local_274);
      local_276 = *(int *)((long)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 4) == local_274 + 1;
    }
    local_275 = local_274 % 10 == 5;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar_2,"dmap.find(i) != dmap.end() && dmap.find(i)->second == i + 1"
               ,"(i % 10) == 5",&local_276,&local_275);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&local_218);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)gtest_ar_2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_260,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x43,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)&local_218);
      goto LAB_006b5327;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    local_274 = local_274 + 1;
  } while( true );
}

Assistant:

TEST(Simple, All) {
  google::sparse_hash_set<int> sset;
  google::sparse_hash_map<int, int> smap;
  google::dense_hash_set<int> dset;
  google::dense_hash_map<int, int> dmap;
  dset.set_empty_key(-1);
  dmap.set_empty_key(-1);

  for (int i = 0; i < 100; i += 10) {  // go by tens
    sset.insert(i);
    smap[i] = i + 1;
    dset.insert(i + 5);
    dmap[i + 5] = i + 6;
  }

  for (int i = 0; i < 100; i++) {
    ASSERT_EQ(sset.find(i) != sset.end(), (i % 10) == 0);
    ASSERT_EQ(smap.find(i) != smap.end(), (i % 10) == 0);
    ASSERT_EQ(smap.find(i) != smap.end() && smap.find(i)->second == i + 1,
              (i % 10) == 0);
    ASSERT_EQ(dset.find(i) != dset.end(), (i % 10) == 5);
    ASSERT_EQ(dmap.find(i) != dmap.end(), (i % 10) == 5);
    ASSERT_EQ(dmap.find(i) != dmap.end() && dmap.find(i)->second == i + 1,
              (i % 10) == 5);
  }
}